

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_pragmas.cpp
# Opt level: O0

void __thiscall
slang::parsing::Preprocessor::skipMacroTokensBeforeProtectRegion
          (Preprocessor *this,Token directive,SmallVectorBase<slang::parsing::Token> *skippedTokens)

{
  iterator pTVar1;
  bool bVar2;
  Diagnostic *this_00;
  iterator pTVar3;
  SourceRange SVar4;
  SmallVectorBase<slang::parsing::Token> *skippedTokens_local;
  Preprocessor *this_local;
  Token directive_local;
  
  directive_local._0_8_ = directive.info;
  this_local = directive._0_8_;
  bVar2 = Token::operator_cast_to_bool(&this->currentToken);
  if (!bVar2) {
    if (this->currentMacroToken != (Token *)0x0) {
      SVar4 = Token::range(this->currentMacroToken);
      this_00 = addDiag(this,(DiagCode)0x100004,SVar4);
      SVar4 = Token::range((Token *)&this_local);
      Diagnostic::addNote(this_00,(DiagCode)0x1c0004,SVar4);
      do {
        SmallVectorBase<slang::parsing::Token>::push_back(skippedTokens,this->currentMacroToken);
        this->currentMacroToken = this->currentMacroToken + 1;
        pTVar1 = this->currentMacroToken;
        pTVar3 = SmallVectorBase<slang::parsing::Token>::end
                           (&(this->expandedTokens).super_SmallVectorBase<slang::parsing::Token>);
      } while (pTVar1 != pTVar3);
      this->currentMacroToken = (Token *)0x0;
      SmallVectorBase<slang::parsing::Token>::clear
                (&(this->expandedTokens).super_SmallVectorBase<slang::parsing::Token>);
    }
    return;
  }
  assert::assertFailed
            ("!currentToken",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/parsing/Preprocessor_pragmas.cpp"
             ,0x171,
             "void slang::parsing::Preprocessor::skipMacroTokensBeforeProtectRegion(Token, SmallVectorBase<Token> &)"
            );
}

Assistant:

void Preprocessor::skipMacroTokensBeforeProtectRegion(Token directive,
                                                      SmallVectorBase<Token>& skippedTokens) {
    // We're about to lex an encoded / encrypted data block based on a pragma
    // protect directive, so we don't expect there to be macro tokens still pending.
    // If there are, issue an error and skip them.
    ASSERT(!currentToken);
    if (currentMacroToken) {
        addDiag(diag::MacroTokensAfterPragmaProtect, currentMacroToken->range())
            .addNote(diag::NoteDirectiveHere, directive.range());

        do {
            skippedTokens.push_back(*currentMacroToken);
            currentMacroToken++;
        } while (currentMacroToken != expandedTokens.end());

        currentMacroToken = nullptr;
        expandedTokens.clear();
    }
}